

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O0

Vec_Wec_t * Gia_PolynGetResult(Hsh_VecMan_t *pHashC,Hsh_VecMan_t *pHashM,Vec_Int_t *vCoefs)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *p;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar3;
  int *__base;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int local_84;
  int local_64;
  int local_60;
  int nNonConst;
  int nLargest;
  int iFirst;
  int iMono;
  int iConst;
  int k;
  int i;
  Vec_Wec_t *vSorted;
  Vec_Wec_t *vPolyn;
  Vec_Int_t *vArray;
  Vec_Int_t *vLevel;
  Vec_Int_t *vClass;
  Vec_Int_t *vCoefs_local;
  Hsh_VecMan_t *pHashM_local;
  Hsh_VecMan_t *pHashC_local;
  
  local_60 = 0;
  local_64 = 0;
  for (nLargest = 0; iVar1 = Vec_IntSize(vCoefs), nLargest < iVar1; nLargest = nLargest + 1) {
    iVar1 = Vec_IntEntry(vCoefs,nLargest);
    if (iVar1 != 0) {
      pVVar3 = Hsh_VecReadEntry(pHashC,iVar1);
      iVar1 = Vec_IntEntry(pVVar3,0);
      iVar1 = Abc_AbsInt(iVar1);
      local_60 = Abc_MaxInt(local_60,iVar1);
      local_64 = local_64 + 1;
    }
  }
  p = Vec_WecStart(local_60 + 1);
  for (nLargest = 0; iVar1 = Vec_IntSize(vCoefs), nLargest < iVar1; nLargest = nLargest + 1) {
    iVar1 = Vec_IntEntry(vCoefs,nLargest);
    if (iVar1 != 0) {
      pVVar3 = Hsh_VecReadEntry(pHashC,iVar1);
      iVar2 = Vec_IntEntry(pVVar3,0);
      iVar2 = Abc_AbsInt(iVar2);
      pVVar3 = Vec_WecEntry(p,iVar2);
      pVVar4 = Hsh_VecReadEntry(pHashM,nLargest);
      iVar2 = Vec_IntSize(pVVar4);
      if (iVar2 == 0) {
        local_84 = -1;
      }
      else {
        local_84 = Vec_IntEntry(pVVar4,0);
      }
      Vec_IntPushThree(pVVar3,iVar1,nLargest,local_84);
    }
  }
  p_00 = Vec_WecAlloc(local_64 << 1);
  for (iConst = 0; iVar1 = Vec_WecSize(p), iConst < iVar1; iConst = iConst + 1) {
    pVVar3 = Vec_WecEntry(p,iConst);
    __base = Vec_IntArray(pVVar3);
    iVar1 = Vec_IntSize(pVVar3);
    qsort(__base,(long)(iVar1 / 3),0xc,Gia_PolynGetResultCompare);
    for (iMono = 0; iVar1 = Vec_IntSize(pVVar3), iMono + 2 < iVar1; iMono = iMono + 3) {
      iVar1 = Vec_IntEntry(pVVar3,iMono);
      iVar2 = Vec_IntEntry(pVVar3,iMono + 1);
      Vec_IntEntry(pVVar3,iMono + 2);
      pVVar4 = Hsh_VecReadEntry(pHashC,iVar1);
      Vec_IntCheckUniqueOrderAbs(pVVar4);
      pVVar5 = Vec_WecPushLevel(p_00);
      iVar1 = Vec_IntSize(pVVar4);
      Vec_IntGrow(pVVar5,iVar1);
      Vec_IntAppend(pVVar5,pVVar4);
      pVVar4 = Hsh_VecReadEntry(pHashM,iVar2);
      Vec_IntCheckUniqueOrder(pVVar4);
      pVVar5 = Vec_WecPushLevel(p_00);
      iVar1 = Vec_IntSize(pVVar4);
      Vec_IntGrow(pVVar5,iVar1);
      Vec_IntAppend(pVVar5,pVVar4);
    }
  }
  iVar1 = Vec_WecSize(p_00);
  if (iVar1 == local_64 * 2) {
    Vec_WecFree(p);
    return p_00;
  }
  __assert_fail("Vec_WecSize(vPolyn) == 2*nNonConst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                ,0x17c,"Vec_Wec_t *Gia_PolynGetResult(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *)")
  ;
}

Assistant:

Vec_Wec_t * Gia_PolynGetResult( Hsh_VecMan_t * pHashC, Hsh_VecMan_t * pHashM, Vec_Int_t * vCoefs )
{
    Vec_Int_t * vClass, * vLevel, * vArray;
    Vec_Wec_t * vPolyn, * vSorted;
    int i, k, iConst, iMono, iFirst;
    // find the largest 
    int nLargest = 0, nNonConst = 0;
    Vec_IntForEachEntry( vCoefs, iConst, iMono )
    {
        //Vec_IntPrint( Hsh_VecReadEntry(pHashM, iMono) );
        if ( iConst == 0 ) 
            continue;
        vArray = Hsh_VecReadEntry( pHashC, iConst );
        nLargest = Abc_MaxInt( nLargest, Abc_AbsInt(Vec_IntEntry(vArray, 0)) );
        nNonConst++;
    }
    // sort by the size of the largest coefficient
    vSorted = Vec_WecStart( nLargest+1 );
    Vec_IntForEachEntry( vCoefs, iConst, iMono )
    {
        if ( iConst == 0 ) 
            continue;
        vArray = Hsh_VecReadEntry( pHashC, iConst );
        vLevel = Vec_WecEntry( vSorted, Abc_AbsInt(Vec_IntEntry(vArray, 0)) );
        vArray = Hsh_VecReadEntry( pHashM, iMono );
        iFirst = Vec_IntSize(vArray) ? Vec_IntEntry(vArray, 0) : -1;
        Vec_IntPushThree( vLevel, iConst, iMono, iFirst );
    }
    // reload in the given order
    vPolyn = Vec_WecAlloc( 2*nNonConst );
    Vec_WecForEachLevel( vSorted, vClass, i )
    {
        // sort monomials by the index of the first variable
        qsort( Vec_IntArray(vClass), (size_t)(Vec_IntSize(vClass)/3), 12, (int (*)(const void *, const void *))Gia_PolynGetResultCompare );
        Vec_IntForEachEntryTriple( vClass, iConst, iMono, iFirst, k )
        {
            vArray = Hsh_VecReadEntry( pHashC, iConst );
            Vec_IntCheckUniqueOrderAbs( vArray );
            vLevel = Vec_WecPushLevel( vPolyn );
            Vec_IntGrow( vLevel, Vec_IntSize(vArray) );
            Vec_IntAppend( vLevel, vArray );

            vArray = Hsh_VecReadEntry( pHashM, iMono );
            Vec_IntCheckUniqueOrder( vArray );
            vLevel = Vec_WecPushLevel( vPolyn );
            Vec_IntGrow( vLevel, Vec_IntSize(vArray) );
            Vec_IntAppend( vLevel, vArray );
        }
    }
    assert( Vec_WecSize(vPolyn) == 2*nNonConst );
    Vec_WecFree( vSorted );
    return vPolyn;
}